

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::grow(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
       *this,uint AtLeast)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  uint *puVar4;
  DenseSetPair<unsigned_short> *pDVar5;
  unsigned_short *puVar6;
  unsigned_short *puVar7;
  LargeRep *pLVar8;
  LargeRep LVar9;
  LargeRep OldRep;
  DenseSetPair<unsigned_short> *E;
  DenseSetPair<unsigned_short> *P;
  unsigned_short TombstoneKey;
  DenseSetPair<unsigned_short> *pDStack_38;
  unsigned_short EmptyKey;
  DenseSetPair<unsigned_short> *TmpEnd;
  DenseSetPair<unsigned_short> *TmpBegin;
  AlignedCharArrayUnion<llvm::detail::DenseSetPair<unsigned_short>[4]> TmpStorage;
  uint local_14;
  uint AtLeast_local;
  SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
  *this_local;
  
  local_14 = AtLeast;
  if (3 < AtLeast) {
    TmpStorage.buffer[4] = '@';
    TmpStorage.buffer[5] = '\0';
    TmpStorage.buffer[6] = '\0';
    TmpStorage.buffer[7] = '\0';
    uVar3 = NextPowerOf2((ulong)(AtLeast - 1));
    TmpStorage.buffer._0_4_ = SUB84(uVar3,0);
    puVar4 = std::max<unsigned_int>((uint *)(TmpStorage.buffer + 4),(uint *)&TmpStorage);
    local_14 = *puVar4;
  }
  if (((undefined1  [24])*this & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
    pLVar8 = getLargeRep(this);
    pDVar5 = pLVar8->Buckets;
    uVar1 = *(ulong *)&pLVar8->NumBuckets;
    getLargeRep(this);
    if (local_14 < 5) {
      *(uint *)this = *(uint *)this & 0xfffffffe | 1;
    }
    else {
      pLVar8 = getLargeRep(this);
      LVar9 = allocateBuckets(this,local_14);
      pLVar8->Buckets = LVar9.Buckets;
      pLVar8->NumBuckets = LVar9.NumBuckets;
    }
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,pDVar5,pDVar5 + (uVar1 & 0xffffffff));
    deallocate_buffer(pDVar5,(uVar1 & 0xffffffff) << 1,2);
  }
  else if (3 < local_14) {
    pDStack_38 = (DenseSetPair<unsigned_short> *)((long)&TmpBegin + 4);
    TmpEnd = pDStack_38;
    P._6_2_ = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
              ::getEmptyKey();
    P._4_2_ = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
              ::getTombstoneKey();
    E = getBuckets(this);
    pDVar5 = E + 4;
    for (; E != pDVar5; E = E + 1) {
      puVar6 = detail::DenseSetPair<unsigned_short>::getFirst(E);
      bVar2 = DenseMapInfo<unsigned_short>::isEqual(puVar6,(unsigned_short *)((long)&P + 6));
      if (!bVar2) {
        puVar6 = detail::DenseSetPair<unsigned_short>::getFirst(E);
        bVar2 = DenseMapInfo<unsigned_short>::isEqual(puVar6,(unsigned_short *)((long)&P + 4));
        if (!bVar2) {
          if (3 < (ulong)((long)pDStack_38 - (long)TmpEnd >> 1)) {
            __assert_fail("size_t(TmpEnd - TmpBegin) < InlineBuckets && \"Too many inline buckets!\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                          ,0x405,
                          "void llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::grow(unsigned int) [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, InlineBuckets = 4, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>]"
                         );
          }
          puVar6 = detail::DenseSetPair<unsigned_short>::getFirst(pDStack_38);
          puVar7 = detail::DenseSetPair<unsigned_short>::getFirst(E);
          *puVar6 = *puVar7;
          detail::DenseSetPair<unsigned_short>::getSecond(pDStack_38);
          detail::DenseSetPair<unsigned_short>::getSecond(E);
          pDStack_38 = pDStack_38 + 1;
          detail::DenseSetPair<unsigned_short>::getSecond(E);
        }
      }
      detail::DenseSetPair<unsigned_short>::getFirst(E);
    }
    *(uint *)this = *(uint *)this & 0xfffffffe;
    pLVar8 = getLargeRep(this);
    LVar9 = allocateBuckets(this,local_14);
    pLVar8->Buckets = LVar9.Buckets;
    pLVar8->NumBuckets = LVar9.NumBuckets;
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,TmpEnd,pDStack_38);
  }
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    if (AtLeast >= InlineBuckets)
      AtLeast = std::max<unsigned>(64, NextPowerOf2(AtLeast-1));

    if (Small) {
      if (AtLeast < InlineBuckets)
        return; // Nothing to do.

      // First move the inline buckets into a temporary storage.
      AlignedCharArrayUnion<BucketT[InlineBuckets]> TmpStorage;
      BucketT *TmpBegin = reinterpret_cast<BucketT *>(TmpStorage.buffer);
      BucketT *TmpEnd = TmpBegin;

      // Loop over the buckets, moving non-empty, non-tombstones into the
      // temporary storage. Have the loop move the TmpEnd forward as it goes.
      const KeyT EmptyKey = this->getEmptyKey();
      const KeyT TombstoneKey = this->getTombstoneKey();
      for (BucketT *P = getBuckets(), *E = P + InlineBuckets; P != E; ++P) {
        if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
            !KeyInfoT::isEqual(P->getFirst(), TombstoneKey)) {
          assert(size_t(TmpEnd - TmpBegin) < InlineBuckets &&
                 "Too many inline buckets!");
          ::new (&TmpEnd->getFirst()) KeyT(std::move(P->getFirst()));
          ::new (&TmpEnd->getSecond()) ValueT(std::move(P->getSecond()));
          ++TmpEnd;
          P->getSecond().~ValueT();
        }
        P->getFirst().~KeyT();
      }

      // Now make this map use the large rep, and move all the entries back
      // into it.
      Small = false;
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
      this->moveFromOldBuckets(TmpBegin, TmpEnd);
      return;
    }

    LargeRep OldRep = std::move(*getLargeRep());
    getLargeRep()->~LargeRep();
    if (AtLeast <= InlineBuckets) {
      Small = true;
    } else {
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
    }

    this->moveFromOldBuckets(OldRep.Buckets, OldRep.Buckets+OldRep.NumBuckets);

    // Free the old table.
    deallocate_buffer(OldRep.Buckets, sizeof(BucketT) * OldRep.NumBuckets,
                      alignof(BucketT));
  }